

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

void __thiscall mpt::message_store::message_store(message_store *this,metatype *next)

{
  metatype *next_local;
  message_store *this_local;
  
  logger::logger(&this->super_logger);
  reference<mpt::metatype>::reference(&this->super_reference<mpt::metatype>,next);
  (this->super_logger)._vptr_logger = (_func_int **)&PTR_log_0017b390;
  typed_array<mpt::message_store::entry>::typed_array(&this->_msg,-1);
  this->_act = 0;
  this->_flags = '\a';
  this->_ignore = '\x10';
  this->_level = '\0';
  return;
}

Assistant:

message_store::message_store(metatype *next) : reference<metatype>(next), _act(0), _flags(FlowNormal), _ignore(Debug), _level(0)
{ }